

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# biginteger.h
# Opt level: O0

void __thiscall
rapidjson::internal::BigInteger::BigInteger(BigInteger *this,char *decimals,size_t length)

{
  RapidJSONException *this_00;
  size_t kMaxDigitPerIteration;
  size_t i;
  ulong local_20;
  size_t length_local;
  char *decimals_local;
  BigInteger *this_local;
  
  this->count_ = 1;
  if (length == 0) {
    this_00 = (RapidJSONException *)__cxa_allocate_exception(0x10);
    cereal::RapidJSONException::RapidJSONException
              (this_00,"rapidjson internal assertion failure: length > 0");
    __cxa_throw(this_00,&cereal::RapidJSONException::typeinfo,
                cereal::RapidJSONException::~RapidJSONException);
  }
  this->digits_[0] = 0;
  kMaxDigitPerIteration = 0;
  for (local_20 = length; 0x12 < local_20; local_20 = local_20 - 0x13) {
    AppendDecimal64(this,decimals + kMaxDigitPerIteration,decimals + kMaxDigitPerIteration + 0x13);
    kMaxDigitPerIteration = kMaxDigitPerIteration + 0x13;
  }
  if (local_20 != 0) {
    AppendDecimal64(this,decimals + kMaxDigitPerIteration,
                    decimals + local_20 + kMaxDigitPerIteration);
  }
  return;
}

Assistant:

BigInteger(const char* decimals, size_t length) : count_(1) {
        CEREAL_RAPIDJSON_ASSERT(length > 0);
        digits_[0] = 0;
        size_t i = 0;
        const size_t kMaxDigitPerIteration = 19;  // 2^64 = 18446744073709551616 > 10^19
        while (length >= kMaxDigitPerIteration) {
            AppendDecimal64(decimals + i, decimals + i + kMaxDigitPerIteration);
            length -= kMaxDigitPerIteration;
            i += kMaxDigitPerIteration;
        }

        if (length > 0)
            AppendDecimal64(decimals + i, decimals + i + length);
    }